

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O2

int Csw_CutMerge(Csw_Man_t *p,Csw_Cut_t *pCut0,Csw_Cut_t *pCut1,Csw_Cut_t *pCut)

{
  int iVar1;
  Csw_Cut_t *pC1;
  Csw_Cut_t *pC0;
  
  if (p->nLeafMax < 1) {
    __assert_fail("p->nLeafMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/csw/cswCut.c"
                  ,0x17e,"int Csw_CutMerge(Csw_Man_t *, Csw_Cut_t *, Csw_Cut_t *, Csw_Cut_t *)");
  }
  pC1 = pCut1;
  pC0 = pCut0;
  if (pCut0->nFanins < pCut1->nFanins) {
    pC1 = pCut0;
    pC0 = pCut1;
  }
  iVar1 = Csw_CutMergeOrdered(p,pC0,pC1,pCut);
  if (iVar1 != 0) {
    pCut->uSign = pCut1->uSign | pCut0->uSign;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int Csw_CutMerge( Csw_Man_t * p, Csw_Cut_t * pCut0, Csw_Cut_t * pCut1, Csw_Cut_t * pCut )
{ 
    assert( p->nLeafMax > 0 );
    // merge the nodes
    if ( pCut0->nFanins < pCut1->nFanins )
    {
        if ( !Csw_CutMergeOrdered( p, pCut1, pCut0, pCut ) )
            return 0;
    }
    else
    {
        if ( !Csw_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
            return 0;
    }
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    return 1;
}